

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O1

void __thiscall HACD::HACD::DenormalizeData(HACD *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  double *pdVar6;
  double dVar7;
  
  sVar5 = this->m_nPoints;
  if (sVar5 != 0) {
    dVar7 = this->m_diag;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar7 = dVar7 / (this->m_scale + this->m_scale);
      pdVar6 = this->m_points->m_data + 2;
      do {
        dVar1 = pdVar6[-1];
        dVar2 = *pdVar6;
        dVar3 = (this->m_barycenter).m_data[1];
        dVar4 = (this->m_barycenter).m_data[2];
        ((Vec3<double> *)(pdVar6 + -2))->m_data[0] =
             dVar7 * ((Vec3<double> *)(pdVar6 + -2))->m_data[0] + (this->m_barycenter).m_data[0];
        pdVar6[-1] = dVar7 * dVar1 + dVar3;
        *pdVar6 = dVar7 * dVar2 + dVar4;
        pdVar6 = pdVar6 + 3;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
  }
  return;
}

Assistant:

void HACD::DenormalizeData()
	{
		if (m_nPoints == 0)
		{
			return;
		}
		if (m_diag != 0.0)
		{
			const Real diag = static_cast<Real>(m_diag / (2.0 * m_scale));
			for (size_t v = 0; v < m_nPoints ; v++) 
			{
				m_points[v] = m_points[v] * diag + m_barycenter;
			}
		}
    }